

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGLogBestError(xmlRelaxNGValidCtxtPtr ctxt)

{
  uint uVar1;
  xmlRelaxNGStatesPtr pxVar2;
  xmlRelaxNGValidStatePtr pxVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  int iVar6;
  
  pxVar2 = ctxt->states;
  if (pxVar2 != (xmlRelaxNGStatesPtr)0x0) {
    uVar1 = pxVar2->nbState;
    if (0 < (int)uVar1) {
      uVar4 = 0xffffffff;
      iVar6 = 1000000;
      uVar5 = 0;
      do {
        pxVar3 = pxVar2->tabState[uVar5];
        if (pxVar3 != (xmlRelaxNGValidStatePtr)0x0) {
          if (pxVar3->seq == (xmlNodePtr)0x0) {
            if (pxVar3->nbAttrLeft < iVar6 || (int)uVar4 == -1) {
              uVar4 = uVar5 & 0xffffffff;
              iVar6 = pxVar3->nbAttrLeft;
            }
          }
          else if (100000 < iVar6 || (int)uVar4 == -1) {
            uVar4 = uVar5 & 0xffffffff;
            iVar6 = 100000;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      if ((uint)uVar4 < uVar1) {
        ctxt->state = pxVar2->tabState[uVar4];
        xmlRelaxNGValidateElementEnd(ctxt,1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGLogBestError(xmlRelaxNGValidCtxtPtr ctxt)
{
    int best;

    if ((ctxt == NULL) || (ctxt->states == NULL) ||
        (ctxt->states->nbState <= 0))
        return;

    best = xmlRelaxNGBestState(ctxt);
    if ((best >= 0) && (best < ctxt->states->nbState)) {
        ctxt->state = ctxt->states->tabState[best];

        xmlRelaxNGValidateElementEnd(ctxt, 1);
    }
}